

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

char * sqlite3_filename_wal(char *zFilename)

{
  uint uVar1;
  char *pcVar2;
  
  pcVar2 = sqlite3_filename_journal(zFilename);
  if (pcVar2 == (char *)0x0) {
    pcVar2 = (char *)0x0;
  }
  else {
    uVar1 = sqlite3Strlen30(pcVar2);
    pcVar2 = pcVar2 + (ulong)uVar1 + 1;
  }
  return pcVar2;
}

Assistant:

SQLITE_API const char *sqlite3_filename_wal(const char *zFilename){
#ifdef SQLITE_OMIT_WAL
  return 0;
#else
  zFilename = sqlite3_filename_journal(zFilename);
  if( zFilename ) zFilename += sqlite3Strlen30(zFilename) + 1;
  return zFilename;
#endif
}